

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O3

int x509_get_entries(uchar **p,uchar *end,mbedtls_x509_crl_entry *entry)

{
  size_t *len;
  byte *pbVar1;
  size_t sVar2;
  int iVar3;
  uchar *puVar4;
  mbedtls_x509_crl_entry *pmVar5;
  uchar *puVar6;
  byte *pbVar7;
  uchar *end_00;
  size_t len2;
  size_t entry_len;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  if (*p == end) {
    return 0;
  }
  iVar3 = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
  if (iVar3 != -0x62) {
    if (iVar3 != 0) {
      return iVar3;
    }
    if (0 < (long)local_38) {
      end_00 = *p + local_38;
      do {
        iVar3 = mbedtls_asn1_get_tag(p,end_00,&local_40,0x30);
        if (iVar3 != 0) {
          return iVar3;
        }
        pbVar7 = *p;
        (entry->raw).tag = (uint)*pbVar7;
        (entry->raw).p = pbVar7;
        (entry->raw).len = local_40;
        pbVar7 = pbVar7 + local_40;
        iVar3 = mbedtls_x509_get_serial(p,pbVar7,&entry->serial);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = mbedtls_x509_get_time(p,pbVar7,&entry->revocation_date);
        if (iVar3 != 0) {
          return iVar3;
        }
        local_48 = 0;
        pbVar1 = *p;
        if (pbVar1 < pbVar7) {
          (entry->entry_ext).tag = (uint)*pbVar1;
          (entry->entry_ext).p = pbVar1;
          len = &(entry->entry_ext).len;
          iVar3 = mbedtls_asn1_get_tag(p,pbVar7,len,0x30);
          if (iVar3 == 0) {
            puVar4 = *p;
            sVar2 = *len;
            puVar6 = puVar4 + sVar2;
            if (0 < (long)sVar2) {
              do {
                iVar3 = mbedtls_asn1_get_tag(p,puVar6,&local_48,0x30);
                if (iVar3 != 0) goto LAB_0010ba24;
                puVar4 = *p + local_48;
                *p = puVar4;
              } while (puVar4 < puVar6);
            }
            if (puVar4 != puVar6) {
              return -0x2566;
            }
          }
          else if (iVar3 == -0x62) {
            (entry->entry_ext).p = (uchar *)0x0;
          }
          else {
LAB_0010ba24:
            if (iVar3 + -0x2500 != 0) {
              return iVar3 + -0x2500;
            }
          }
        }
        puVar6 = *p;
        pmVar5 = entry;
        if (puVar6 < end_00) {
          pmVar5 = (mbedtls_x509_crl_entry *)calloc(1,0x68);
          entry->next = pmVar5;
          if (pmVar5 == (mbedtls_x509_crl_entry *)0x0) {
            return -0x2880;
          }
          puVar6 = *p;
        }
        entry = pmVar5;
      } while (puVar6 < end_00);
    }
  }
  return 0;
}

Assistant:

static int x509_get_entries( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_x509_crl_entry *entry )
{
    int ret;
    size_t entry_len;
    mbedtls_x509_crl_entry *cur_entry = entry;

    if( *p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_tag( p, end, &entry_len,
            MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    end = *p + entry_len;

    while( *p < end )
    {
        size_t len2;
        const unsigned char *end2;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &len2,
                MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED ) ) != 0 )
        {
            return( ret );
        }

        cur_entry->raw.tag = **p;
        cur_entry->raw.p = *p;
        cur_entry->raw.len = len2;
        end2 = *p + len2;

        if( ( ret = mbedtls_x509_get_serial( p, end2, &cur_entry->serial ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_x509_get_time( p, end2,
                                   &cur_entry->revocation_date ) ) != 0 )
            return( ret );

        if( ( ret = x509_get_crl_entry_ext( p, end2,
                                            &cur_entry->entry_ext ) ) != 0 )
            return( ret );

        if( *p < end )
        {
            cur_entry->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crl_entry ) );

            if( cur_entry->next == NULL )
                return( MBEDTLS_ERR_X509_ALLOC_FAILED );

            cur_entry = cur_entry->next;
        }
    }

    return( 0 );
}